

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

char * sqlite3_uri_parameter(char *zFilename,char *zParam)

{
  char *zFilename_00;
  char *zParam_local;
  char *zFilename_local;
  
  if ((zFilename == (char *)0x0) || (zParam == (char *)0x0)) {
    zFilename_local = (char *)0x0;
  }
  else {
    zFilename_00 = databaseName(zFilename);
    zFilename_local = uriParameter(zFilename_00,zParam);
  }
  return zFilename_local;
}

Assistant:

SQLITE_API const char *sqlite3_uri_parameter(const char *zFilename, const char *zParam){
  if( zFilename==0 || zParam==0 ) return 0;
  zFilename = databaseName(zFilename);
  return uriParameter(zFilename, zParam);
}